

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O3

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
parse_mods_<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  byte bVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined **local_60 [2];
  undefined **local_50;
  refcount_ptr<boost::exception_detail::error_info_container> local_48;
  char *pcStack_40;
  char *local_38;
  undefined8 local_30;
  error_type local_28;
  source_location local_20;
  
  pbVar2 = (byte *)*begin;
  uVar5 = *(uint *)(this + 0x210);
  uVar4 = 1;
  do {
    bVar1 = *pbVar2;
    bVar3 = (byte)uVar4;
    if (bVar1 < 0x6d) {
      if (0x39 < bVar1) {
        if (bVar1 != 0x69) {
          if (bVar1 == 0x3a) {
            *begin = (char *)(pbVar2 + 1);
            return token_no_mark;
          }
          goto LAB_00127539;
        }
        uVar5 = (uVar5 & 0xfffffffd) + uVar4 * 2;
        goto LAB_001274a0;
      }
      if (bVar1 != 0x2d) {
        if (bVar1 == 0x29) {
          return token_no_mark;
        }
LAB_00127539:
        std::runtime_error::runtime_error((runtime_error *)local_60,"unknown pattern modifier");
        local_48.px_ = (error_info_container *)0x0;
        pcStack_40 = (char *)0x0;
        local_38 = (char *)0x0;
        local_30._0_4_ = -1;
        local_30._4_4_ = -1;
        local_60[0] = &PTR__regex_error_00193398;
        local_50 = &PTR__regex_error_001933c0;
        local_28 = error_paren;
        local_20.file_ =
             "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
        ;
        local_20.function_ =
             "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::parse_mods_(FwdIter &, FwdIter) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
        ;
        local_20.line_ = 0x191;
        local_20.column_ = 0;
        throw_exception<boost::xpressive::regex_error>((regex_error *)local_60,&local_20);
      }
      if (bVar3 == 0) goto LAB_00127539;
      uVar4 = (uint)(bVar3 ^ 1);
    }
    else {
      if (bVar1 == 0x6d) {
        uVar5 = uVar5 & 0xfffffbff;
        uVar6 = ((byte)~bVar3 & 1) << 10;
      }
      else if (bVar1 == 0x73) {
        uVar5 = uVar5 & 0xffffefff;
        uVar6 = ((byte)~bVar3 & 1) << 0xc;
      }
      else {
        if (bVar1 != 0x78) goto LAB_00127539;
        uVar5 = uVar5 & 0xffffdfff;
        uVar6 = uVar4 << 0xd;
      }
      uVar5 = uVar6 | uVar5;
LAB_001274a0:
      *(uint *)(this + 0x210) = uVar5;
    }
    pbVar2 = pbVar2 + 1;
    *begin = (char *)pbVar2;
    if (pbVar2 == (byte *)end) {
      std::runtime_error::runtime_error((runtime_error *)local_60,"incomplete extension");
      local_48.px_ = (error_info_container *)0x0;
      local_60[0] = &PTR__regex_error_00193398;
      local_50 = &PTR__regex_error_001933c0;
      local_28 = error_paren;
      pcStack_40 = 
      "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::parse_mods_(FwdIter &, FwdIter) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
      ;
      local_38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
      ;
      local_30._0_4_ = 0x193;
      local_30._4_4_ = -1;
      throw_exception<boost::xpressive::regex_error>((regex_error *)local_60);
    }
  } while( true );
}

Assistant:

regex_constants::compiler_token_type parse_mods_(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        bool localset = true;
        do switch(*begin)
        {
        case BOOST_XPR_CHAR_(char_type, 'i'): this->flag_(localset, icase_); break;
        case BOOST_XPR_CHAR_(char_type, 'm'): this->flag_(!localset, single_line); break;
        case BOOST_XPR_CHAR_(char_type, 's'): this->flag_(!localset, not_dot_newline); break;
        case BOOST_XPR_CHAR_(char_type, 'x'): this->flag_(localset, ignore_white_space); break;
        case BOOST_XPR_CHAR_(char_type, ':'): ++begin; BOOST_FALLTHROUGH;
        case BOOST_XPR_CHAR_(char_type, ')'): return token_no_mark;
        case BOOST_XPR_CHAR_(char_type, '-'): if(false == (localset = !localset)) break; BOOST_FALLTHROUGH;
        default: BOOST_THROW_EXCEPTION(regex_error(error_paren, "unknown pattern modifier"));
        }
        while(BOOST_XPR_ENSURE_(++begin != end, error_paren, "incomplete extension"));
        // this return is technically unreachable, but this must
        // be here to work around a bug in gcc 4.0
        return token_no_mark;
    }